

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::DropDomainIfEmpty
          (Registry *this,DomainId *aDomainId)

{
  pointer *this_00;
  int iVar1;
  size_type sVar2;
  undefined1 local_98 [8];
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  nwks;
  Network npred;
  Status status;
  DomainId *aDomainId_local;
  Registry *this_local;
  
  npred._95_1_ = 0;
  if (aDomainId->mId != 0xffffffff) {
    this_00 = &nwks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    Network::Network((Network *)this_00);
    std::
    vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ::vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              *)local_98);
    nwks.
    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = aDomainId->mId;
    iVar1 = (*this->mStorage->_vptr_PersistentStorage[0x16])
                      (this->mStorage,this_00,
                       (vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                        *)local_98);
    npred._95_1_ = anon_unknown_0::MapStatus((Status)iVar1);
    if (((npred._95_1_ == kSuccess) || (npred._95_1_ == kNotFound)) &&
       (sVar2 = std::
                vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ::size((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                        *)local_98), sVar2 == 0)) {
      iVar1 = (*this->mStorage->_vptr_PersistentStorage[9])(this->mStorage,aDomainId);
      npred._95_1_ = anon_unknown_0::MapStatus((Status)iVar1);
    }
    std::
    vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               *)local_98);
    Network::~Network((Network *)
                      &nwks.
                       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return npred._95_1_;
}

Assistant:

Registry::Status Registry::DropDomainIfEmpty(const DomainId &aDomainId)
{
    Registry::Status status = Registry::Status::kSuccess;

    if (aDomainId.mId != EMPTY_ID)
    {
        Network              npred;
        std::vector<Network> nwks;

        npred.mDomainId = aDomainId;
        status          = MapStatus(mStorage->Lookup(npred, nwks));
        VerifyOrExit(status == Registry::Status::kSuccess || status == Registry::Status::kNotFound);
        if (nwks.size() == 0)
        {
            // Drop empty domain
            status = MapStatus(mStorage->Del(aDomainId));
        }
    }
exit:
    return status;
}